

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<float> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  init_policy_type iVar7;
  context *this_00;
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  rep rVar13;
  random_engine *rng;
  int iVar14;
  file_observer *x_optimistic;
  file_observer *x_pessimistic;
  int in_R9D;
  long i;
  float theta;
  float fVar15;
  float fVar16;
  float __y;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 extraout_var_00 [60];
  string_view filename;
  float local_3cc;
  bit_array x;
  quadratic_cost_type<float> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  slv;
  file_observer obs;
  undefined1 extraout_var [60];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  this_00 = this->m_ctx;
  normalize_costs<float,baryonyx::itm::quadratic_cost_type<float>>
            (&norm_costs,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<float> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             in_R9D);
  dVar18 = (this_00->parameters).kappa_step;
  dVar1 = (this_00->parameters).delta;
  dVar2 = (this_00->parameters).kappa_max;
  dVar3 = (this_00->parameters).alpha;
  theta = (float)(this_00->parameters).theta;
  if (0.0 <= dVar1) {
    local_3cc = (float)dVar1;
  }
  else {
    local_3cc = compute_delta<float,baryonyx::itm::quadratic_cost_type<float>>
                          (this->m_ctx,&norm_costs,theta,variables);
  }
  dVar1 = (this_00->parameters).w;
  dVar4 = (this_00->parameters).pushing_k_factor;
  dVar5 = (this_00->parameters).pushing_objective_amplifier;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  ::solver_inequalities_01coeff
            (&slv,this->m_rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(this_00->parameters).order,variables);
  dVar6 = (this->m_ctx->parameters).init_policy_random;
  obs.m_pi_obs._0_16_ = ZEXT816(0) << 0x20;
  iVar7 = (this_00->parameters).init_policy;
  if (iVar7 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
              (&x,original_costs,variables,0);
  }
  else {
    if (iVar7 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = (file_observer *)&x;
      x_optimistic = &obs;
    }
    else {
      if (iVar7 != optimistic_solve) goto LAB_00342fca;
      rng = this->m_rng;
      x_pessimistic = &obs;
      x_optimistic = (file_observer *)&x;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_00342fca:
  fVar15 = (float)dVar18;
  fVar16 = (float)dVar2;
  __y = (float)dVar3;
  for (iVar14 = 0; x.super_bit_array_impl.m_size != iVar14; iVar14 = iVar14 + 1) {
    dVar18 = std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (this->m_rng);
    if (dVar18 < dVar6) {
      bit_array_impl::invert(&x.super_bit_array_impl,iVar14);
    }
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             &obs.m_pi_obs.m_ofs);
  dVar18 = (this_00->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer(&obs,filename,slv.m,slv.n,(this_00->parameters).limit);
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar13;
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar13;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
            (&compute,&slv,&x);
  fVar17 = (float)dVar18;
  iVar14 = 0x7fffffff;
  for (i = 0; i != (this_00->parameters).limit; i = i + 1) {
    iVar10 = compute_order::
             run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
                       (&compute,&slv,&x,this->m_rng,fVar17,local_3cc,theta);
    file_observer::make_observation<float>
              (&obs,&slv.ap,
               (float *)slv.P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl,
               (float *)slv.pi._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                        .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl);
    if (iVar10 == 0) {
      dVar18 = quadratic_cost_type<float>::results(original_costs,&x,cost_constant);
      store_if_better(this,&x,dVar18,i);
      auVar20 = ZEXT464((uint)fVar17);
      iVar10 = 0;
      iVar14 = 0;
      goto LAB_0034329e;
    }
    if (iVar10 < iVar14) {
      store_if_better(this,&x,iVar10,i);
      iVar14 = iVar10;
    }
    if ((long)dVar1 < i) {
      auVar19._0_4_ = powf((float)iVar10 / (float)slv.m,__y);
      auVar19._4_60_ = extraout_var;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)fVar17),auVar19._0_16_,ZEXT416((uint)fVar15));
      fVar17 = auVar8._0_4_;
    }
    if ((fVar16 < fVar17) || (bVar9 = is_timelimit_reached(this), bVar9)) break;
  }
  __return_storage_ptr__->status = limit_reached;
LAB_003431bc:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,variables);
  }
  file_observer::~file_observer(&obs);
  compute_order::~compute_order(&compute);
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  ::~solver_inequalities_01coeff(&slv);
  quadratic_cost_type<float>::~quadratic_cost_type(&norm_costs);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&x.super_bit_array_impl.m_data);
  return __return_storage_ptr__;
LAB_0034329e:
  if ((this_00->parameters).pushes_limit <= iVar10) goto LAB_003431bc;
  fVar17 = auVar20._0_4_;
  iVar11 = compute_order::
           push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
                     (&compute,&slv,&x,this->m_rng,fVar17 * (float)dVar4,local_3cc,theta,
                      (float)dVar5);
  if (iVar11 == 0) {
    dVar18 = quadratic_cost_type<float>::results(original_costs,&x,cost_constant);
    store_if_better(this,&x,dVar18,(long)~((this_00->parameters).pushing_iteration_limit * iVar10));
  }
  bVar9 = is_timelimit_reached(this);
  if (bVar9) goto LAB_003431bc;
  iVar11 = 1;
  while( true ) {
    auVar20 = ZEXT464((uint)fVar17);
    if ((this_00->parameters).pushing_iteration_limit <= iVar11 + -1) break;
    iVar12 = compute_order::
             run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
                       (&compute,&slv,&x,this->m_rng,fVar17,local_3cc,theta);
    if (iVar12 == 0) {
      dVar18 = quadratic_cost_type<float>::results(original_costs,&x,cost_constant);
      store_if_better(this,&x,dVar18,
                      (long)((this_00->parameters).pushing_iteration_limit * iVar14 - iVar11));
      auVar20 = ZEXT464((uint)fVar17);
      break;
    }
    if ((double)(iVar11 + -1) <= (this_00->parameters).w) {
      auVar20 = ZEXT464((uint)fVar17);
    }
    else {
      auVar20._0_4_ = powf((float)iVar12 / (float)slv.m,__y);
      auVar20._4_60_ = extraout_var_00;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)fVar17),auVar20._0_16_,ZEXT416((uint)fVar15));
      auVar20 = ZEXT1664(auVar8);
    }
    fVar17 = auVar20._0_4_;
    if (fVar16 < fVar17) break;
    bVar9 = is_timelimit_reached(this);
    if (bVar9) {
      auVar20 = ZEXT464((uint)fVar17);
      break;
    }
    iVar11 = iVar11 + 1;
  }
  iVar14 = iVar14 + -1;
  iVar10 = iVar10 + 1;
  goto LAB_0034329e;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }